

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmesa_context.c
# Opt level: O2

void destroyContextOSMesa(_GLFWwindow *window)

{
  OSMesaContext pvVar1;
  void *__ptr;
  
  pvVar1 = (window->context).osmesa.handle;
  if (pvVar1 != (OSMesaContext)0x0) {
    (*_glfw.osmesa.DestroyContext)(pvVar1);
    (window->context).osmesa.handle = (OSMesaContext)0x0;
  }
  __ptr = (window->context).osmesa.buffer;
  if (__ptr != (void *)0x0) {
    free(__ptr);
    (window->context).osmesa.width = 0;
    (window->context).osmesa.height = 0;
  }
  return;
}

Assistant:

static void destroyContextOSMesa(_GLFWwindow* window)
{
    if (window->context.osmesa.handle)
    {
        OSMesaDestroyContext(window->context.osmesa.handle);
        window->context.osmesa.handle = NULL;
    }

    if (window->context.osmesa.buffer)
    {
        free(window->context.osmesa.buffer);
        window->context.osmesa.width = 0;
        window->context.osmesa.height = 0;
    }
}